

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O3

void __thiscall CTcMake::write_build_config_to_sym_file(CTcMake *this,CVmFile *fp)

{
  char *__s;
  CTcMake *pCVar1;
  uint16_t tmp;
  size_t sVar2;
  CTcMakeDef *pCVar3;
  CTcMakePath *pCVar4;
  textchar_t *ptVar5;
  CTcTokFileDesc *pCVar6;
  char b [2];
  short local_62;
  CTcMake *local_60;
  uint local_58;
  undefined1 local_54;
  
  local_58 = 0x30103;
  local_54 = 0;
  CVmFile::write_bytes(fp,(char *)&local_58,5);
  local_58 = CONCAT31(local_58._1_3_,(char)this->debug_);
  CVmFile::write_bytes(fp,(char *)&local_58,1);
  local_62 = -1;
  pCVar3 = (CTcMakeDef *)&this->def_head_;
  do {
    pCVar3 = pCVar3->nxt_;
    local_62 = local_62 + 1;
  } while (pCVar3 != (CTcMakeDef *)0x0);
  local_60 = this;
  CVmFile::write_bytes(fp,(char *)&local_62,2);
  pCVar3 = this->def_head_;
  if (pCVar3 != (CTcMakeDef *)0x0) {
    do {
      ptVar5 = (pCVar3->sym_).buf_;
      if (ptVar5 == (textchar_t *)0x0) {
        ptVar5 = "";
      }
      sVar2 = strlen(ptVar5);
      local_62 = (short)sVar2;
      CVmFile::write_bytes(fp,(char *)&local_62,2);
      ptVar5 = (pCVar3->sym_).buf_;
      if (ptVar5 == (textchar_t *)0x0) {
        ptVar5 = "";
      }
      sVar2 = strlen(ptVar5);
      CVmFile::write_bytes(fp,ptVar5,sVar2);
      ptVar5 = (pCVar3->expan_).buf_;
      if (ptVar5 == (textchar_t *)0x0) {
        ptVar5 = "";
      }
      sVar2 = strlen(ptVar5);
      local_62 = (short)sVar2;
      CVmFile::write_bytes(fp,(char *)&local_62,2);
      ptVar5 = (pCVar3->expan_).buf_;
      if (ptVar5 == (textchar_t *)0x0) {
        ptVar5 = "";
      }
      sVar2 = strlen(ptVar5);
      CVmFile::write_bytes(fp,ptVar5,sVar2);
      local_58 = CONCAT31(local_58._1_3_,pCVar3->field_0x18) & 0xffffff01;
      CVmFile::write_bytes(fp,(char *)&local_58,1);
      pCVar3 = pCVar3->nxt_;
    } while (pCVar3 != (CTcMakeDef *)0x0);
  }
  pCVar1 = local_60;
  local_62 = 0;
  for (pCVar4 = local_60->inc_head_; pCVar4 != (CTcMakePath *)0x0; pCVar4 = pCVar4->nxt_) {
    local_62 = local_62 + 1;
  }
  CVmFile::write_bytes(fp,(char *)&local_62,2);
  pCVar4 = pCVar1->inc_head_;
  if (pCVar4 != (CTcMakePath *)0x0) {
    do {
      ptVar5 = (pCVar4->path_).buf_;
      if (ptVar5 == (textchar_t *)0x0) {
        ptVar5 = "";
      }
      sVar2 = strlen(ptVar5);
      local_62 = (short)sVar2;
      CVmFile::write_bytes(fp,(char *)&local_62,2);
      ptVar5 = (pCVar4->path_).buf_;
      if (ptVar5 == (textchar_t *)0x0) {
        ptVar5 = "";
      }
      sVar2 = strlen(ptVar5);
      CVmFile::write_bytes(fp,ptVar5,sVar2);
      pCVar4 = pCVar4->nxt_;
    } while (pCVar4 != (CTcMakePath *)0x0);
  }
  local_62 = (short)G_tok->next_filedesc_id_;
  if (G_tok->desc_head_ == (CTcTokFileDesc *)0x0) {
    CVmFile::write_bytes(fp,(char *)&local_62,2);
  }
  else {
    pCVar6 = G_tok->desc_head_->next_;
    local_62 = local_62 + -1;
    CVmFile::write_bytes(fp,(char *)&local_62,2);
    if (pCVar6 != (CTcTokFileDesc *)0x0) {
      do {
        sVar2 = strlen(pCVar6->fname_);
        local_62 = (short)sVar2;
        CVmFile::write_bytes(fp,(char *)&local_62,2);
        __s = pCVar6->fname_;
        sVar2 = strlen(__s);
        CVmFile::write_bytes(fp,__s,sVar2);
        pCVar6 = pCVar6->next_;
      } while (pCVar6 != (CTcTokFileDesc *)0x0);
    }
  }
  return;
}

Assistant:

void CTcMake::write_build_config_to_sym_file(CVmFile *fp)
{
    CTcMakeDef *def;
    CTcMakePath *inc;
    CTcTokFileDesc *desc;
    size_t cnt;
    char buf[32];

    /* write the compiler version */
    buf[0] = TC_VSN_MAJOR;
    buf[1] = TC_VSN_MINOR;
    buf[2] = TC_VSN_REV;
    buf[3] = TC_VSN_PATCH;
    buf[4] = TC_VSN_DEVBUILD;
    fp->write_bytes(buf, 5);

    /* write the debug mode */
    buf[0] = (char)debug_;
    fp->write_bytes(buf, 1);

    /* 
     *   Write our list of pre-defined and pre-undefined symbols (-D and
     *   -U options).  If any changes are made to the -D/-U list, we'll
     *   have to rebuild, since these options can change the meaning of
     *   the source code.  
     */

    /* count the symbols in our list */
    for (cnt = 0, def = def_head_ ; def != 0 ;
         def = def->get_next(), ++cnt) ;

    /* write the count */
    fp->write_uint2(cnt);

    /* write each option */
    for (def = def_head_ ; def != 0 ; def = def->get_next())
    {
        /* write the symbol */
        fp->write_uint2(get_strlen(def->get_sym()));
        fp->write_bytes(def->get_sym(), get_strlen(def->get_sym()));

        /* write the expansion */
        if (def->get_expan() != 0)
        {
            fp->write_uint2(get_strlen(def->get_expan()));
            fp->write_bytes(def->get_expan(), get_strlen(def->get_expan()));
        }
        else
            fp->write_uint2(0);

        /* write the define/undefine flag */
        buf[0] = (char)def->is_def();
        fp->write_bytes(buf, 1);
    }
    
    /* 
     *   Write the #include search list.  If the search list changes, the
     *   location in which we find a particular header file could change,
     *   hence the text inserted by a #include directive could change,
     *   hence we'd have to rebuild.  
     */

    /* count the list */
    for (cnt = 0, inc = inc_head_ ; inc != 0 ;
         inc = inc->get_next(), ++cnt) ;

    /* write the count */
    fp->write_uint2(cnt);

    /* write the list */
    for (inc = inc_head_ ; inc != 0 ; inc = inc->get_next())
    {
        /* write the entry */
        fp->write_uint2(get_strlen(inc->get_path()));
        fp->write_bytes(inc->get_path(), get_strlen(inc->get_path()));
    }

    /*
     *   Write the actual list of #include files that were included in the
     *   program.  We'll have to check each of these to see if any of them
     *   have been modified more recently than the symbol file.
     */

    /* get the count */
    cnt = G_tok->get_filedesc_count();

    /* 
     *   start with the second descriptor, because the first is the source
     *   file itself, which isn't part of the include list 
     */
    desc = G_tok->get_first_filedesc();
    if (desc != 0)
    {
        /* skip the first descriptor */
        desc = desc->get_next();

        /* we're not writing it, so don't count it */
        --cnt;
    }

    /* write the count, excluding the actual source file */
    fp->write_uint2(cnt);

    /* write the descriptors */
    for ( ; desc != 0 ; desc = desc->get_next())
    {
        /* 
         *   Write the filename string.  Store the fully resolved local
         *   filename, not the original unresolved name, because we want to
         *   be able to detect a change in the configuration that points us
         *   to a different resolved local file.  
         */
        fp->write_uint2(get_strlen(desc->get_fname()));
        fp->write_bytes(desc->get_fname(), get_strlen(desc->get_fname()));
    }
}